

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

int __thiscall MlmWrap::processMlmReplyMsg(MlmWrap *this,TrodesMsg *msg)

{
  bool bVar1;
  pointer ppVar2;
  undefined8 in_RSI;
  long *in_RDI;
  bool tracker;
  iterator search;
  string type;
  int rc;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_ffffffffffffff50;
  iterator __position;
  string local_88 [32];
  TrodesMsg *in_stack_ffffffffffffff98;
  _Self local_58;
  byte local_4d;
  _Self local_40;
  string local_38 [36];
  int local_14;
  undefined8 local_10;
  
  local_14 = 0;
  local_10 = in_RSI;
  TrodesMsg::popstr_abi_cxx11_(in_stack_ffffffffffffff98);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),(key_type *)0x37495c)
  ;
  local_4d = 0;
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  bVar1 = std::operator!=(&local_40,&local_58);
  if (bVar1) {
    __position._M_node = (_Base_ptr)in_RDI[7];
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                           *)0x3749b2);
    zloop_timer_end((zloop_t *)__position._M_node,ppVar2->second);
    std::
    map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::erase_abi_cxx11_(in_stack_ffffffffffffff50,__position);
    local_4d = 1;
  }
  std::__cxx11::string::string(local_88,local_38);
  local_14 = (**(code **)(*in_RDI + 0x28))(in_RDI,local_88,local_10);
  std::__cxx11::string::~string(local_88);
  if ((local_4d & 1) != 0) {
    zstr_send((void *)in_RDI[9],"BURs");
  }
  std::__cxx11::string::~string(local_38);
  return local_14;
}

Assistant:

int MlmWrap::processMlmReplyMsg(TrodesMsg &msg) {
    int rc = 0;
    std::string type = msg.popstr();
    auto search = trackers.find(type);
    bool tracker = false;
    //There is a timer still out for this reply. Cancel it, remove it from map, reply success to unblock.
    if(search != trackers.end()){
        zloop_timer_end(reactor, search->second);
        trackers.erase(search);
        tracker = true;
    }

    rc = processReplyMsg(type, msg);
    if(tracker){
        zstr_send(usrpipe, blockrepsuccess);
    }
    return(rc);
}